

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void exprCodeBetween(Parse *pParse,Expr *pExpr,int dest,_func_void_Parse_ptr_Expr_ptr_int_int *xJump
                    ,int jumpIfNull)

{
  int iReg;
  int local_154;
  undefined1 local_150 [4];
  int regFree1;
  Expr exprX;
  Expr compRight;
  Expr compLeft;
  Expr exprAnd;
  int jumpIfNull_local;
  _func_void_Parse_ptr_Expr_ptr_int_int *xJump_local;
  int dest_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  local_154 = 0;
  memset(&compRight.y,0,0x48);
  memset(&exprX.y,0,0x48);
  memset(&compLeft.y,0,0x48);
  exprNodeCopy((Expr *)local_150,pExpr->pLeft);
  compLeft.y.sub.iAddr._0_1_ = 0x2c;
  compRight.y.sub.iAddr._0_1_ = 0x39;
  compLeft.u.zToken = local_150;
  compLeft.pLeft = ((pExpr->x).pList)->a[0].pExpr;
  exprX.y.sub.iAddr._0_1_ = 0x37;
  compRight.u.zToken = local_150;
  compRight.pLeft = (Expr *)((pExpr->x).pSelect)->pSrc;
  iReg = exprCodeVector(pParse,(Expr *)local_150,&local_154);
  exprToRegister((Expr *)local_150,iReg);
  if (xJump == (_func_void_Parse_ptr_Expr_ptr_int_int *)0x0) {
    regFree1 = regFree1 | 1;
    sqlite3ExprCodeTarget(pParse,(Expr *)&compLeft.y.sub,dest);
  }
  else {
    (*xJump)(pParse,(Expr *)&compLeft.y,dest,jumpIfNull);
  }
  sqlite3ReleaseTempReg(pParse,local_154);
  return;
}

Assistant:

static void exprCodeBetween(
  Parse *pParse,    /* Parsing and code generating context */
  Expr *pExpr,      /* The BETWEEN expression */
  int dest,         /* Jump destination or storage location */
  void (*xJump)(Parse*,Expr*,int,int), /* Action to take */
  int jumpIfNull    /* Take the jump if the BETWEEN is NULL */
){
 Expr exprAnd;     /* The AND operator in  x>=y AND x<=z  */
  Expr compLeft;    /* The  x>=y  term */
  Expr compRight;   /* The  x<=z  term */
  Expr exprX;       /* The  x  subexpression */
  int regFree1 = 0; /* Temporary use register */

  memset(&compLeft, 0, sizeof(Expr));
  memset(&compRight, 0, sizeof(Expr));
  memset(&exprAnd, 0, sizeof(Expr));

  assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
  exprNodeCopy(&exprX, pExpr->pLeft);
  exprAnd.op = TK_AND;
  exprAnd.pLeft = &compLeft;
  exprAnd.pRight = &compRight;
  compLeft.op = TK_GE;
  compLeft.pLeft = &exprX;
  compLeft.pRight = pExpr->x.pList->a[0].pExpr;
  compRight.op = TK_LE;
  compRight.pLeft = &exprX;
  compRight.pRight = pExpr->x.pList->a[1].pExpr;
  exprToRegister(&exprX, exprCodeVector(pParse, &exprX, &regFree1));
  if( xJump ){
    xJump(pParse, &exprAnd, dest, jumpIfNull);
  }else{
    /* Mark the expression is being from the ON or USING clause of a join
    ** so that the sqlite3ExprCodeTarget() routine will not attempt to move
    ** it into the Parse.pConstExpr list.  We should use a new bit for this,
    ** for clarity, but we are out of bits in the Expr.flags field so we
    ** have to reuse the EP_FromJoin bit.  Bummer. */
    exprX.flags |= EP_FromJoin;
    sqlite3ExprCodeTarget(pParse, &exprAnd, dest);
  }
  sqlite3ReleaseTempReg(pParse, regFree1);

  /* Ensure adequate test coverage */
  testcase( xJump==sqlite3ExprIfTrue  && jumpIfNull==0 && regFree1==0 );
  testcase( xJump==sqlite3ExprIfTrue  && jumpIfNull==0 && regFree1!=0 );
  testcase( xJump==sqlite3ExprIfTrue  && jumpIfNull!=0 && regFree1==0 );
  testcase( xJump==sqlite3ExprIfTrue  && jumpIfNull!=0 && regFree1!=0 );
  testcase( xJump==sqlite3ExprIfFalse && jumpIfNull==0 && regFree1==0 );
  testcase( xJump==sqlite3ExprIfFalse && jumpIfNull==0 && regFree1!=0 );
  testcase( xJump==sqlite3ExprIfFalse && jumpIfNull!=0 && regFree1==0 );
  testcase( xJump==sqlite3ExprIfFalse && jumpIfNull!=0 && regFree1!=0 );
  testcase( xJump==0 );
}